

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_daload(ExecutionEngine *this)

{
  int iVar1;
  ValueType VVar2;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar3;
  Value VVar4;
  Value VVar5;
  undefined4 local_58;
  Value padding;
  Value arrayref;
  Value index;
  ArrayObject *array;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  arrayref.data.longValue._4_4_ = VVar4.type;
  if (arrayref.data.longValue._4_4_ != 4) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ea,"void ExecutionEngine::i_daload()");
  }
  VVar5 = Frame::popTopOfOperandStack(this_01);
  padding.data.longValue._4_4_ = VVar5.type;
  if (padding.data.longValue._4_4_ != 9) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ec,"void ExecutionEngine::i_daload()");
  }
  arrayref._0_8_ = VVar5.data;
  iVar1 = (*(code *)**(undefined8 **)arrayref._0_8_)();
  if (iVar1 != 2) {
    __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ed,"void ExecutionEngine::i_daload()");
  }
  if (arrayref._0_8_ == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"NullPointerException");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  index.printType = VVar4.data._0_4_;
  VVar2 = ArrayObject::getSize((ArrayObject *)arrayref._0_8_);
  if ((index.printType <= VVar2) && (-1 < (int)index.printType)) {
    VVar4.type = 10;
    VVar4.printType = local_58;
    VVar4.data = (anon_union_8_10_52016fac_for_data)padding._0_8_;
    Frame::pushIntoOperandStack(this_01,VVar4);
    VVar4 = ArrayObject::getValue((ArrayObject *)arrayref._0_8_,index.printType);
    Frame::pushIntoOperandStack(this_01,VVar4);
    this_01->pc = this_01->pc + 1;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

void ExecutionEngine::i_daload() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue > array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    Value padding;
    padding.type = ValueType::PADDING;
    
    topFrame->pushIntoOperandStack(padding);
    topFrame->pushIntoOperandStack(array->getValue(index.data.intValue));
    topFrame->pc += 1;
}